

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_test.cxx
# Opt level: O2

int raft_server_test::multiple_config_change_test(void)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  RaftPkg *pRVar4;
  element_type *peVar5;
  int iVar6;
  cmd_result_code cVar7;
  ostream *poVar8;
  pointer psVar9;
  int __how;
  int __how_00;
  int __how_01;
  int __how_02;
  element_type *endpoint;
  pointer ppRVar10;
  initializer_list<RaftPkg_*> __l;
  undefined1 local_680 [16];
  undefined1 local_670 [24];
  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  configs_out;
  ptr<cluster_config> c_conf;
  ptr<FakeNetworkBase> f_base;
  ptr<srv_config> s4_conf;
  ptr<raft_result> ret;
  vector<RaftPkg_*,_std::allocator<RaftPkg_*>_> pkgs;
  id local_5e8;
  undefined1 local_5e0 [16];
  string s4_addr;
  string s3_addr;
  string s2_addr;
  string s1_addr;
  RaftPkg s1;
  RaftPkg s4;
  RaftPkg s3;
  RaftPkg s2;
  
  raft_functional_common::reset_log_files();
  std::make_shared<nuraft::FakeNetworkBase>();
  std::__cxx11::string::string((string *)&s1_addr,"S1",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s2_addr,"S2",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s3_addr,"S3",(allocator *)&s1);
  std::__cxx11::string::string((string *)&s4_addr,"S4",(allocator *)&s1);
  RaftPkg::RaftPkg(&s1,&f_base,1,&s1_addr);
  RaftPkg::RaftPkg(&s2,&f_base,2,&s2_addr);
  RaftPkg::RaftPkg(&s3,&f_base,3,&s3_addr);
  RaftPkg::RaftPkg(&s4,&f_base,4,&s4_addr);
  __l._M_len = 4;
  __l._M_array = (iterator)local_680;
  local_680._0_8_ = &s1;
  local_680._8_8_ = &s2;
  local_670._0_8_ = &s3;
  local_670._8_8_ = &s4;
  std::vector<RaftPkg_*,_std::allocator<RaftPkg_*>_>::vector
            (&pkgs,__l,(allocator_type *)&configs_out);
  iVar6 = launch_servers(&pkgs,(raft_params *)0x0,false);
  if (iVar6 == 0) {
    iVar6 = make_group(&pkgs);
    peVar5 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (iVar6 == 0) {
      std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)local_680,
                 (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                 (s3.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 8));
      nuraft::raft_server::remove_srv((raft_server *)local_5e0,(int)peVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_5e0 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_680 + 8));
      peVar5 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)local_680,
                 (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                 (s4.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 8));
      nuraft::raft_server::remove_srv((raft_server *)&ret,(int)peVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_680 + 8));
      cVar7 = nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
              ::get_result_code(ret.
                                super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
      peVar5 = s1.raftServer.super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (cVar7 < OK) {
        std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)local_680,
                   (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)
                   (s4.sMgr.super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   + 8));
        nuraft::raft_server::set_priority(peVar5,*(int *)local_680._0_8_,10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_680 + 8));
        local_680._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_670._0_8_ = local_670._0_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)local_670;
        nuraft::FakeNetwork::execReqResp
                  (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(string *)local_680);
        std::__cxx11::string::~string((string *)local_680);
        local_680._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_670._0_8_ = local_670._0_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)local_670;
        nuraft::FakeNetwork::execReqResp
                  (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(string *)local_680);
        std::__cxx11::string::~string((string *)local_680);
        local_680._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_670._0_8_ = local_670._0_8_ & 0xffffffffffffff00;
        local_680._0_8_ = (RaftPkg *)local_670;
        nuraft::FakeNetwork::execReqResp
                  (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(string *)local_680);
        std::__cxx11::string::~string((string *)local_680);
        local_680._8_8_ = (RaftPkg *)0x0;
        local_670._0_8_ = local_670._0_8_ & 0xffffffffffffff00;
        endpoint = (element_type *)local_680;
        local_680._0_8_ = (RaftPkg *)local_670;
        nuraft::FakeNetwork::execReqResp
                  (s1.fNet.super___shared_ptr<nuraft::FakeNetwork,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(string *)endpoint);
        std::__cxx11::string::~string((string *)local_680);
        iVar6 = wait_for_sm_exec(&pkgs,(size_t)endpoint);
        if (iVar6 == 0) {
          for (ppRVar10 = pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
                          super__Vector_impl_data._M_start; iVar6 = (int)endpoint,
              ppRVar10 !=
              pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppRVar10 = ppRVar10 + 1) {
            pRVar4 = *ppRVar10;
            endpoint = (element_type *)
                       ((pRVar4->sMgr).
                        super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8
                       );
            std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)local_680,
                       (__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> *)endpoint);
            iVar6 = *(int *)local_680._0_8_;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_680 + 8));
            if (iVar6 != 3) {
              configs_out.
              super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              configs_out.
              super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              configs_out.
              super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              nuraft::raft_server::get_srv_config_all
                        ((pRVar4->raftServer).
                         super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &configs_out);
              iVar6 = (int)((ulong)((long)configs_out.
                                          super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)configs_out.
                                         super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4);
              psVar9 = configs_out.
                       super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (iVar6 == 3) {
                for (; psVar9 != configs_out.
                                 super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish; psVar9 = psVar9 + 1) {
                  uVar1 = ((psVar9->
                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->id_;
                  if ((4 < uVar1) || ((0x16U >> (uVar1 & 0x1f) & 1) == 0)) {
                    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                    poVar8 = std::operator<<(poVar8,"        time: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                    TestSuite::getTimeString_abi_cxx11_();
                    poVar8 = std::operator<<(poVar8,(string *)local_680);
                    poVar8 = std::operator<<(poVar8,"\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,"      thread: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[33m");
                    pp_Var2 = poVar8->_vptr_basic_ostream;
                    p_Var3 = pp_Var2[-3];
                    *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
                         *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
                    *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
                    poVar8 = std::operator<<(poVar8,0x30);
                    c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)pthread_self();
                    std::hash<std::thread::id>::operator()
                              ((hash<std::thread::id> *)&s4_conf,(id *)&c_conf);
                    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                    *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
                         *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) &
                         0xffffffb5 | 2;
                    poVar8 = std::operator<<(poVar8,"\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,"          in: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[36m");
                    poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
                    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,"          at: ");
                    poVar8 = std::operator<<(poVar8,"\x1b[32m");
                    poVar8 = std::operator<<(poVar8,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                            );
                    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x321);
                    poVar8 = std::operator<<(poVar8,"\x1b[0m");
                    poVar8 = std::operator<<(poVar8,"\n");
                    poVar8 = std::operator<<(poVar8,
                                             "    value of: \x1b[1;34ms_conf->get_id() == 1 || s_conf->get_id() == 2 || s_conf->get_id() == 4\x1b[0m\n"
                                            );
                    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                    poVar8 = std::operator<<(poVar8,"true");
                    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                    poVar8 = std::operator<<(poVar8,"false");
                    std::operator<<(poVar8,"\x1b[0m\n");
                    std::__cxx11::string::~string((string *)local_680);
                    TestSuite::failHandler();
                    goto LAB_001193fa;
                  }
                }
                nuraft::raft_server::get_config((raft_server *)&c_conf);
                endpoint = c_conf.
                           super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                nuraft::cluster_config::get_server
                          ((cluster_config *)&s4_conf,
                           (int)c_conf.
                                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
                iVar6 = (s4_conf.super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->priority_;
                if (iVar6 == 10) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&s4_conf.
                              super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&c_conf.
                              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  std::
                  vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                  ::~vector(&configs_out);
                  goto LAB_001191b3;
                }
                poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                poVar8 = std::operator<<(poVar8,"        time: ");
                poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar8 = std::operator<<(poVar8,(string *)local_680);
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"      thread: ");
                poVar8 = std::operator<<(poVar8,"\x1b[33m");
                pp_Var2 = poVar8->_vptr_basic_ostream;
                p_Var3 = pp_Var2[-3];
                *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
                     *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
                *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
                poVar8 = std::operator<<(poVar8,0x30);
                local_5e8._M_thread = pthread_self();
                std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)(local_670 + 0x17),&local_5e8);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
                     *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) &
                     0xffffffb5 | 2;
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"          in: ");
                poVar8 = std::operator<<(poVar8,"\x1b[36m");
                poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
                poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"          at: ");
                poVar8 = std::operator<<(poVar8,"\x1b[32m");
                poVar8 = std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                        );
                poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x327);
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,
                                         "    value of: \x1b[1;34ms4_conf->get_priority()\x1b[0m\n")
                ;
                poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,10);
                poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
                std::operator<<(poVar8,"\x1b[0m\n");
                std::__cxx11::string::~string((string *)local_680);
                TestSuite::failHandler();
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&s4_conf.
                            super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&c_conf.
                            super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              }
              else {
                poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                poVar8 = std::operator<<(poVar8,"        time: ");
                poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
                TestSuite::getTimeString_abi_cxx11_();
                poVar8 = std::operator<<(poVar8,(string *)local_680);
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"      thread: ");
                poVar8 = std::operator<<(poVar8,"\x1b[33m");
                pp_Var2 = poVar8->_vptr_basic_ostream;
                p_Var3 = pp_Var2[-3];
                *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
                     *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
                *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
                poVar8 = std::operator<<(poVar8,0x30);
                c_conf.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)pthread_self();
                std::hash<std::thread::id>::operator()
                          ((hash<std::thread::id> *)&s4_conf,(id *)&c_conf);
                poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
                *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
                     *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) &
                     0xffffffb5 | 2;
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"          in: ");
                poVar8 = std::operator<<(poVar8,"\x1b[36m");
                poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
                poVar8 = std::operator<<(poVar8,"()\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,"          at: ");
                poVar8 = std::operator<<(poVar8,"\x1b[32m");
                poVar8 = std::operator<<(poVar8,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                        );
                poVar8 = std::operator<<(poVar8,"\x1b[0m:");
                poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x31c);
                poVar8 = std::operator<<(poVar8,"\x1b[0m");
                poVar8 = std::operator<<(poVar8,"\n");
                poVar8 = std::operator<<(poVar8,
                                         "    value of: \x1b[1;34mconfigs_out.size()\x1b[0m\n");
                poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,3);
                poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
                poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
                poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar6);
                std::operator<<(poVar8,"\x1b[0m\n");
                std::__cxx11::string::~string((string *)local_680);
                TestSuite::failHandler();
              }
LAB_001193fa:
              std::
              vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
              ::~vector(&configs_out);
              goto LAB_00118cd2;
            }
LAB_001191b3:
          }
          print_stats(&pkgs);
          nuraft::raft_server::shutdown
                    (s1.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     iVar6,__how);
          nuraft::raft_server::shutdown
                    (s2.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     iVar6,__how_00);
          nuraft::raft_server::shutdown
                    (s3.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     iVar6,__how_01);
          nuraft::raft_server::shutdown
                    (s4.raftServer.
                     super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     iVar6,__how_02);
          iVar6 = 0;
          nuraft::FakeNetworkBase::destroy
                    (f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
        else {
          poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar8 = std::operator<<(poVar8,"        time: ");
          poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
          TestSuite::getTimeString_abi_cxx11_();
          poVar8 = std::operator<<(poVar8,(string *)local_680);
          poVar8 = std::operator<<(poVar8,"\x1b[0m");
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"      thread: ");
          poVar8 = std::operator<<(poVar8,"\x1b[33m");
          pp_Var2 = poVar8->_vptr_basic_ostream;
          p_Var3 = pp_Var2[-3];
          *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
               *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
          *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
          poVar8 = std::operator<<(poVar8,0x30);
          configs_out.
          super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
          std::hash<std::thread::id>::operator()
                    ((hash<std::thread::id> *)&c_conf,(id *)&configs_out);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
               *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) & 0xffffffb5 |
               2;
          poVar8 = std::operator<<(poVar8,"\x1b[0m");
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"          in: ");
          poVar8 = std::operator<<(poVar8,"\x1b[36m");
          poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
          poVar8 = std::operator<<(poVar8,"()\x1b[0m");
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,"          at: ");
          poVar8 = std::operator<<(poVar8,"\x1b[32m");
          poVar8 = std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                  );
          poVar8 = std::operator<<(poVar8,"\x1b[0m:");
          poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x312);
          poVar8 = std::operator<<(poVar8,"\x1b[0m");
          poVar8 = std::operator<<(poVar8,"\n");
          poVar8 = std::operator<<(poVar8,
                                   "    value of: \x1b[1;34mwait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC)\x1b[0m\n"
                                  );
          poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
          poVar8 = std::operator<<(poVar8,"0");
          poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
          poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
          iVar6 = -1;
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
          std::operator<<(poVar8,"\x1b[0m\n");
          std::__cxx11::string::~string((string *)local_680);
          TestSuite::failHandler();
        }
      }
      else {
        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar8 = std::operator<<(poVar8,"        time: ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
        TestSuite::getTimeString_abi_cxx11_();
        poVar8 = std::operator<<(poVar8,(string *)local_680);
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"      thread: ");
        poVar8 = std::operator<<(poVar8,"\x1b[33m");
        pp_Var2 = poVar8->_vptr_basic_ostream;
        p_Var3 = pp_Var2[-3];
        *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
             *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
        *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
        poVar8 = std::operator<<(poVar8,0x30);
        configs_out.
        super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
        std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&c_conf,(id *)&configs_out);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
             *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2
        ;
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"          in: ");
        poVar8 = std::operator<<(poVar8,"\x1b[36m");
        poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
        poVar8 = std::operator<<(poVar8,"()\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"          at: ");
        poVar8 = std::operator<<(poVar8,"\x1b[32m");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                                );
        poVar8 = std::operator<<(poVar8,"\x1b[0m:");
        poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x304);
        poVar8 = std::operator<<(poVar8,"\x1b[0m");
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"    expected: ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;34m0 > ret->get_result_code()\x1b[0m\n");
        poVar8 = std::operator<<(poVar8,"    value of ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;32m0\x1b[0m: ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;31m");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
        poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
        poVar8 = std::operator<<(poVar8,"    value of ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;32mret->get_result_code()\x1b[0m: ");
        poVar8 = std::operator<<(poVar8,"\x1b[1;31m");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,cVar7);
        std::operator<<(poVar8,"\x1b[0m\n");
        std::__cxx11::string::~string((string *)local_680);
        TestSuite::failHandler();
LAB_00118cd2:
        iVar6 = -1;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&ret.
                  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      poVar8 = std::operator<<(poVar8,"        time: ");
      poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
      TestSuite::getTimeString_abi_cxx11_();
      poVar8 = std::operator<<(poVar8,(string *)local_680);
      poVar8 = std::operator<<(poVar8,"\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"      thread: ");
      poVar8 = std::operator<<(poVar8,"\x1b[33m");
      pp_Var2 = poVar8->_vptr_basic_ostream;
      p_Var3 = pp_Var2[-3];
      *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
           *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
      *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
      poVar8 = std::operator<<(poVar8,0x30);
      configs_out.
      super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
      std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&ret,(id *)&configs_out);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
           *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
      poVar8 = std::operator<<(poVar8,"\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"          in: ");
      poVar8 = std::operator<<(poVar8,"\x1b[36m");
      poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
      poVar8 = std::operator<<(poVar8,"()\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"          at: ");
      poVar8 = std::operator<<(poVar8,"\x1b[32m");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                              );
      poVar8 = std::operator<<(poVar8,"\x1b[0m:");
      poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2fc);
      poVar8 = std::operator<<(poVar8,"\x1b[0m");
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"    value of: \x1b[1;34mmake_group( pkgs )\x1b[0m\n");
      poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
      poVar8 = std::operator<<(poVar8,"0");
      poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
      poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
      iVar6 = -1;
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
      std::operator<<(poVar8,"\x1b[0m\n");
      std::__cxx11::string::~string((string *)local_680);
      TestSuite::failHandler();
    }
  }
  else {
    poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar8 = std::operator<<(poVar8,"        time: ");
    poVar8 = std::operator<<(poVar8,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::operator<<(poVar8,(string *)local_680);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"      thread: ");
    poVar8 = std::operator<<(poVar8,"\x1b[33m");
    pp_Var2 = poVar8->_vptr_basic_ostream;
    p_Var3 = pp_Var2[-3];
    *(uint *)(&poVar8->field_0x18 + (long)p_Var3) =
         *(uint *)(&poVar8->field_0x18 + (long)p_Var3) & 0xffffffb5 | 8;
    *(undefined8 *)(&poVar8->field_0x10 + (long)pp_Var2[-3]) = 4;
    poVar8 = std::operator<<(poVar8,0x30);
    configs_out.
    super__Vector_base<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pthread_self();
    std::hash<std::thread::id>::operator()((hash<std::thread::id> *)&ret,(id *)&configs_out);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) =
         *(uint *)(&poVar8->field_0x18 + (long)poVar8->_vptr_basic_ostream[-3]) & 0xffffffb5 | 2;
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          in: ");
    poVar8 = std::operator<<(poVar8,"\x1b[36m");
    poVar8 = std::operator<<(poVar8,"multiple_config_change_test");
    poVar8 = std::operator<<(poVar8,"()\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"          at: ");
    poVar8 = std::operator<<(poVar8,"\x1b[32m");
    poVar8 = std::operator<<(poVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/raft_server_test.cxx"
                            );
    poVar8 = std::operator<<(poVar8,"\x1b[0m:");
    poVar8 = std::operator<<(poVar8,"\x1b[1;35m");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x2fb);
    poVar8 = std::operator<<(poVar8,"\x1b[0m");
    poVar8 = std::operator<<(poVar8,"\n");
    poVar8 = std::operator<<(poVar8,"    value of: \x1b[1;34mlaunch_servers( pkgs )\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"    expected: \x1b[1;32m");
    poVar8 = std::operator<<(poVar8,"0");
    poVar8 = std::operator<<(poVar8,"\x1b[0m\n");
    poVar8 = std::operator<<(poVar8,"      actual: \x1b[1;31m");
    iVar6 = -1;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
    std::operator<<(poVar8,"\x1b[0m\n");
    std::__cxx11::string::~string((string *)local_680);
    TestSuite::failHandler();
  }
  std::_Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>::~_Vector_base
            (&pkgs.super__Vector_base<RaftPkg_*,_std::allocator<RaftPkg_*>_>);
  RaftPkg::~RaftPkg(&s4);
  RaftPkg::~RaftPkg(&s3);
  RaftPkg::~RaftPkg(&s2);
  RaftPkg::~RaftPkg(&s1);
  std::__cxx11::string::~string((string *)&s4_addr);
  std::__cxx11::string::~string((string *)&s3_addr);
  std::__cxx11::string::~string((string *)&s2_addr);
  std::__cxx11::string::~string((string *)&s1_addr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&f_base.super___shared_ptr<nuraft::FakeNetworkBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return iVar6;
}

Assistant:

int multiple_config_change_test() {
    reset_log_files();
    ptr<FakeNetworkBase> f_base = cs_new<FakeNetworkBase>();

    std::string s1_addr = "S1";
    std::string s2_addr = "S2";
    std::string s3_addr = "S3";
    std::string s4_addr = "S4";

    RaftPkg s1(f_base, 1, s1_addr);
    RaftPkg s2(f_base, 2, s2_addr);
    RaftPkg s3(f_base, 3, s3_addr);
    RaftPkg s4(f_base, 4, s4_addr);
    std::vector<RaftPkg*> pkgs = {&s1, &s2, &s3, &s4};

    CHK_Z( launch_servers( pkgs ) );
    CHK_Z( make_group( pkgs ) );

    // Remove two nodes without waiting commit.
    s1.raftServer->remove_srv( s3.getTestMgr()->get_srv_config()->get_id() );

    // Cannot remove multiple servers at once, should return error.
    ptr<raft_result> ret =
        s1.raftServer->remove_srv( s4.getTestMgr()->get_srv_config()->get_id() );
    CHK_GT(0, ret->get_result_code());

    // Priority change is OK.
    s1.raftServer->set_priority(s4.getTestMgr()->get_srv_config()->get_id(), 10);

    // Leave req/resp.
    s1.fNet->execReqResp();
    // Leave done, notify to peers.
    s1.fNet->execReqResp();
    // Probably one more.
    s1.fNet->execReqResp();
    // Notify new commit.
    s1.fNet->execReqResp();
    // Wait for bg commit for configuration change.
    CHK_Z( wait_for_sm_exec(pkgs, COMMIT_TIMEOUT_SEC) );

    // S3 should be removed.
    for (RaftPkg* pp: pkgs) {
        if (pp->getTestMgr()->get_srv_config()->get_id() == 3) continue;

        std::vector< ptr< srv_config > > configs_out;
        pp->raftServer->get_srv_config_all(configs_out);

        // Only S1, S2, and S4 should exist.
        CHK_EQ(3, configs_out.size());
        for (auto& entry: configs_out) {
            ptr<srv_config>& s_conf = entry;
            CHK_TRUE( s_conf->get_id() == 1 ||
                      s_conf->get_id() == 2 ||
                      s_conf->get_id() == 4 );
        }

        // S4's priority should be 10.
        ptr<cluster_config> c_conf = pp->raftServer->get_config();
        ptr<srv_config> s4_conf = c_conf->get_server(4);
        CHK_EQ(10, s4_conf->get_priority());
    }

    print_stats(pkgs);

    s1.raftServer->shutdown();
    s2.raftServer->shutdown();
    s3.raftServer->shutdown();
    s4.raftServer->shutdown();

    f_base->destroy();

    return 0;
}